

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectjson.cpp
# Opt level: O2

bool readFromFile(QFile *device,QJsonArray *allMetaObjects)

{
  FILE *pFVar1;
  QJsonParseError QVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QJsonDocument metaObjects;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char> local_a8;
  QJsonDocument local_90;
  QJsonParseError local_88;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char> local_68;
  QArrayDataPointer<char> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QIODevice::readAll((QByteArray *)&local_68,(QIODevice *)device);
  pFVar1 = _stderr;
  if ((undefined1 *)local_68.size == (undefined1 *)0x0) {
    (*(device->super_QFileDevice).super_QIODevice._vptr_QIODevice[0x13])(&local_80,device);
    QString::toLocal8Bit((QByteArray *)&local_50,(QString *)&local_80);
    if (local_50.ptr == (char *)0x0) {
      local_50.ptr = &QByteArray::_empty;
    }
    bVar3 = false;
    fprintf(pFVar1,"%s:0: metatypes input file is empty\n",local_50.ptr);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  }
  else {
    local_88.offset = -1;
    local_88.error = NoError;
    local_90.d._M_t.
    super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
    super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
         (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)
         &DAT_aaaaaaaaaaaaaaaa;
    QJsonDocument::fromJson(&local_90,(QByteArray *)&local_68,&local_88);
    pFVar1 = _stderr;
    bVar3 = local_88.error == NoError;
    if (bVar3) {
      QJsonDocument::object((QJsonDocument *)&local_80);
      QJsonValue::QJsonValue((QJsonValue *)&local_50,(QJsonObject *)&local_80);
      QJsonArray::append(allMetaObjects,(QJsonValue *)&local_50);
      QJsonValue::~QJsonValue((QJsonValue *)&local_50);
      QJsonObject::~QJsonObject((QJsonObject *)&local_80);
    }
    else {
      (*(device->super_QFileDevice).super_QIODevice._vptr_QIODevice[0x13])(&local_80,device);
      QString::toLocal8Bit((QByteArray *)&local_50,(QString *)&local_80);
      QVar2 = local_88;
      if (local_50.ptr == (char *)0x0) {
        local_50.ptr = &QByteArray::_empty;
      }
      QJsonParseError::errorString((QString *)&local_c0,&local_88);
      QString::toLocal8Bit((QByteArray *)&local_a8,(QString *)&local_c0);
      if (local_a8.ptr == (char *)0x0) {
        local_a8.ptr = &QByteArray::_empty;
      }
      fprintf(pFVar1,"%s:%d: %s\n",local_50.ptr,(ulong)QVar2 & 0xffffffff,local_a8.ptr);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    }
    QJsonDocument::~QJsonDocument(&local_90);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

static bool readFromFile(QFile *device, QJsonArray *allMetaObjects)
{
    const QByteArray contents = device->readAll();
    if (contents.isEmpty()) {
        fprintf(stderr, "%s:0: metatypes input file is empty\n", qPrintable(device->fileName()));
        return false;
    }

    QJsonParseError error {};
    QJsonDocument metaObjects = QJsonDocument::fromJson(contents, &error);
    if (error.error != QJsonParseError::NoError) {
        fprintf(stderr, "%s:%d: %s\n", qPrintable(device->fileName()), error.offset,
                qPrintable(error.errorString()));
        return false;
    }

    allMetaObjects->append(metaObjects.object());
    return true;
}